

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t spvtools::val::CompositesPass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpVectorExtractDynamic) {
    __local._4_4_ = anon_unknown_2::ValidateVectorExtractDynamic(_,inst);
  }
  else if (OVar1 == OpVectorInsertDynamic) {
    __local._4_4_ = anon_unknown_2::ValidateVectorInsertDyanmic(_,inst);
  }
  else if (OVar1 == OpVectorShuffle) {
    __local._4_4_ = anon_unknown_2::ValidateVectorShuffle(_,inst);
  }
  else if (OVar1 == OpCompositeConstruct) {
    __local._4_4_ = anon_unknown_2::ValidateCompositeConstruct(_,inst);
  }
  else if (OVar1 == OpCompositeExtract) {
    __local._4_4_ = anon_unknown_2::ValidateCompositeExtract(_,inst);
  }
  else if (OVar1 == OpCompositeInsert) {
    __local._4_4_ = anon_unknown_2::ValidateCompositeInsert(_,inst);
  }
  else if (OVar1 == OpCopyObject) {
    __local._4_4_ = anon_unknown_2::ValidateCopyObject(_,inst);
  }
  else if (OVar1 == OpTranspose) {
    __local._4_4_ = anon_unknown_2::ValidateTranspose(_,inst);
  }
  else if (OVar1 == OpCopyLogical) {
    __local._4_4_ = anon_unknown_2::ValidateCopyLogical(_,inst);
  }
  else {
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t CompositesPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVectorExtractDynamic:
      return ValidateVectorExtractDynamic(_, inst);
    case spv::Op::OpVectorInsertDynamic:
      return ValidateVectorInsertDyanmic(_, inst);
    case spv::Op::OpVectorShuffle:
      return ValidateVectorShuffle(_, inst);
    case spv::Op::OpCompositeConstruct:
      return ValidateCompositeConstruct(_, inst);
    case spv::Op::OpCompositeExtract:
      return ValidateCompositeExtract(_, inst);
    case spv::Op::OpCompositeInsert:
      return ValidateCompositeInsert(_, inst);
    case spv::Op::OpCopyObject:
      return ValidateCopyObject(_, inst);
    case spv::Op::OpTranspose:
      return ValidateTranspose(_, inst);
    case spv::Op::OpCopyLogical:
      return ValidateCopyLogical(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}